

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>
wabt::MakeUnique<wabt::FuncType>(void)

{
  FuncType *this;
  __uniq_ptr_data<wabt::FuncType,_std::default_delete<wabt::FuncType>,_true,_true> in_RDI;
  
  this = (FuncType *)operator_new(0x80);
  FuncType::FuncType(this,(string_view)ZEXT816(0));
  *(FuncType **)
   in_RDI.super___uniq_ptr_impl<wabt::FuncType,_std::default_delete<wabt::FuncType>_>._M_t.
   super__Tuple_impl<0UL,_wabt::FuncType_*,_std::default_delete<wabt::FuncType>_>.
   super__Head_base<0UL,_wabt::FuncType_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<wabt::FuncType,_std::default_delete<wabt::FuncType>,_true,_true>)
         (tuple<wabt::FuncType_*,_std::default_delete<wabt::FuncType>_>)
         in_RDI.super___uniq_ptr_impl<wabt::FuncType,_std::default_delete<wabt::FuncType>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FuncType_*,_std::default_delete<wabt::FuncType>_>.
         super__Head_base<0UL,_wabt::FuncType_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}